

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgCalcScc(Abc_TgMan_t *pMan,int *pOut,int fSort)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int a;
  int ve;
  int vb;
  TiedGroup *pGrp;
  int k;
  int j;
  int i;
  int fSort_local;
  int *pOut_local;
  Abc_TgMan_t *pMan_local;
  
  Abc_TtSccInCofs(pMan->pTruth,pMan->nVars,pOut);
  pGrp._4_4_ = 0;
  k = 0;
  do {
    if (pMan->nGVars <= pGrp._4_4_) {
      if (fSort != 0) {
        for (_ve = pMan->pGroup; _ve < pMan->pGroup + pMan->nGroups; _ve = _ve + 1) {
          iVar4 = (int)_ve->iStart;
          cVar1 = _ve->nGVars;
          k = iVar4;
          while (k = k + 1, k < iVar4 + cVar1) {
            iVar2 = pOut[k];
            pGrp._4_4_ = k;
            while( true ) {
              bVar3 = false;
              if (iVar4 < pGrp._4_4_) {
                bVar3 = iVar2 < pOut[pGrp._4_4_ + -1];
              }
              if (!bVar3) break;
              pOut[pGrp._4_4_] = pOut[pGrp._4_4_ + -1];
              pGrp._4_4_ = pGrp._4_4_ + -1;
            }
            pOut[pGrp._4_4_] = iVar2;
          }
        }
      }
      return;
    }
    pOut[pGrp._4_4_] = pOut[k];
    cVar1 = pMan->pPerm[pGrp._4_4_];
    while (pGrp._0_4_ = (int)cVar1, -1 < (int)pGrp) {
      k = k + 1;
      if ((-1 < pMan->symLink[(int)pGrp]) && (pOut[pGrp._4_4_] != pOut[k])) {
        __assert_fail("pMan->symLink[k] < 0 || pOut[j] == pOut[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x8fc,"void Abc_TgCalcScc(Abc_TgMan_t *, int *, int)");
      }
      cVar1 = pMan->symLink[(int)pGrp];
    }
    pGrp._4_4_ = pGrp._4_4_ + 1;
  } while( true );
}

Assistant:

static void Abc_TgCalcScc(Abc_TgMan_t * pMan, int * pOut, int fSort)
{
    int i, j, k;
    TiedGroup * pGrp;

    Abc_TtSccInCofs(pMan->pTruth, pMan->nVars, pOut);

    for (i = j = 0; j < pMan->nGVars; j++)
    {
        pOut[j] = pOut[i];
        for (k = pMan->pPerm[j]; k >= 0; k = pMan->symLink[k])
        {
            i++;
            assert(pMan->symLink[k] < 0 || pOut[j] == pOut[i]);
        }
    }
    if (!fSort) return;

    for (pGrp = pMan->pGroup; pGrp < pMan->pGroup + pMan->nGroups; pGrp++)
    {
        int vb = pGrp->iStart, ve = vb + pGrp->nGVars;
        for (i = vb + 1; i < ve; i++)
        {
            int a = pOut[i];
            for (j = i; j > vb && pOut[j - 1] > a; j--)
                pOut[j] = pOut[j - 1];
            pOut[j] = a;
        }
    }
}